

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManReportMemory(Gla_Man_t *p)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Gla_Obj_t *pGVar4;
  long lVar5;
  Gla_Obj_t *pGVar6;
  long lVar7;
  long lVar8;
  int level;
  Rnm_Man_t *p_00;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  double dVar22;
  
  iVar1 = p->pGia->nObjs;
  dVar9 = sat_solver2_memory(p->pSat,1);
  dVar10 = sat_solver2_memory_proof(p->pSat);
  lVar8 = (long)p->nObjs * 0x28 + (long)p->pGia->nObjs * 4;
  auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar12._0_8_ = lVar8;
  auVar12._12_4_ = 0x45300000;
  p_00 = p->pRnm;
  dVar22 = (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  dVar11 = Rnm_ManMemoryUsage(p_00);
  level = (int)p_00;
  pGVar4 = p->pObjs;
  pGVar6 = pGVar4 + p->nObjs;
  for (; pGVar4 < pGVar6; pGVar4 = pGVar4 + 1) {
    lVar8 = (long)(pGVar4->vFrames).nCap << 2;
    auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar15._0_8_ = lVar8;
    auVar15._12_4_ = 0x45300000;
    dVar22 = dVar22 + (auVar15._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  }
  lVar8 = (long)iVar1 * 0xc;
  auVar16._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar16._0_8_ = lVar8;
  auVar16._12_4_ = 0x45300000;
  dVar17 = (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  lVar8 = (long)p->vAddedNew->nCap << 2;
  auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar18._0_8_ = lVar8;
  auVar18._12_4_ = 0x45300000;
  lVar7 = (long)p->vTemp->nCap << 2;
  auVar19._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar19._0_8_ = lVar7;
  auVar19._12_4_ = 0x45300000;
  lVar5 = (long)p->vAbs->nCap << 2;
  auVar20._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar20._0_8_ = lVar5;
  auVar20._12_4_ = 0x45300000;
  dVar22 = dVar11 + dVar22 + dVar10 + dVar9 + dVar17 +
           (auVar20._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
           (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
           (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) + 208.0;
  Abc_Print(level,"%s =","Memory: AIG      ");
  bVar2 = NAN(dVar22);
  bVar3 = dVar22 == 0.0;
  uVar13 = SUB84((dVar17 * 100.0) / dVar22,0);
  if ((bVar3) && (!bVar2)) {
    uVar13 = 0;
  }
  uVar14 = SUB84((dVar9 * 100.0) / dVar22,0);
  if ((bVar3) && (!bVar2)) {
    uVar14 = 0;
  }
  uVar21 = SUB84((dVar22 * 100.0) / dVar22,0);
  if ((bVar3) && (!bVar2)) {
    uVar21 = 0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar17 * 9.5367431640625e-07,uVar13);
  Abc_Print(level,"%s =","Memory: SAT      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,uVar14);
  Abc_Print(level,"%s =","Memory: Proof    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Map      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Refine   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: Other    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(level,"%s =","Memory: TOTAL    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar22 * 9.5367431640625e-07,uVar21);
  return;
}

Assistant:

void Gla_ManReportMemory( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    double memTot = 0;
    double memAig = Gia_ManObjNum(p->pGia) * sizeof(Gia_Obj_t);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = p->nObjs * sizeof(Gla_Obj_t) + Gia_ManObjNum(p->pGia) * sizeof(int);
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memOth = sizeof(Gla_Man_t);
    for ( pGla = p->pObjs; pGla < p->pObjs + p->nObjs; pGla++ )
        memMap += Vec_IntCap(&pGla->vFrames) * sizeof(int);
    memOth += Vec_IntCap(p->vAddedNew) * sizeof(int);
    memOth += Vec_IntCap(p->vTemp) * sizeof(int);
    memOth += Vec_IntCap(p->vAbs) * sizeof(int);
    memTot = memAig + memSat + memPro + memMap + memRef + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}